

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::TextureSpecCase::iterate(TextureSpecCase *this)

{
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deBool dVar6;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *log_00;
  NotSupportedError *this_01;
  char *str;
  PixelFormat *pPVar7;
  TestError *this_02;
  Context *local_6580;
  Context *local_6558;
  Context *local_6548;
  int local_64ec;
  deUint32 texTarget;
  int ndx_2;
  int ndx_1;
  int ndx;
  MultisamplePixelBufferAccess local_64b8;
  MultisamplePixelBufferAccess local_6490;
  ReferenceContextLimits local_6468;
  undefined1 local_6410 [8];
  ReferenceContext refContext;
  undefined1 local_250 [8];
  ReferenceContextBuffers refBuffers;
  undefined1 local_1c8 [8];
  GLContext gles2Context;
  int y;
  int x;
  int height;
  int width;
  Random rnd;
  TestLog *log;
  RenderTarget *renderTarget;
  RenderContext *renderCtx;
  TextureSpecCase *this_local;
  RenderTarget *this_00;
  
  context = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*context->_vptr_RenderContext[4])();
  this_00 = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar1 = tcu::RenderTarget::getWidth(this_00);
  if ((iVar1 < this->m_width) ||
     (iVar1 = tcu::RenderTarget::getHeight(this_00), iVar1 < this->m_height)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Too small viewport","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
               ,0x1a4);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&height,dVar2);
  iVar1 = tcu::RenderTarget::getWidth(this_00);
  iVar1 = ::deMin32(iVar1,0x100);
  iVar3 = tcu::RenderTarget::getHeight(this_00);
  iVar3 = ::deMin32(iVar3,0x100);
  iVar4 = tcu::RenderTarget::getWidth(this_00);
  iVar4 = de::Random::getInt((Random *)&height,0,iVar4 - iVar1);
  iVar5 = tcu::RenderTarget::getHeight(this_00);
  gles2Context.m_programs.
  super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       de::Random::getInt((Random *)&height,0,iVar5 - iVar3);
  tcu::Vector<int,_4>::Vector
            ((Vector<int,_4> *)&refBuffers.m_stencilbuffer.m_data.m_cap,iVar4,
             gles2Context.m_programs.
             super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage._4_4_,iVar1,iVar3);
  sglr::GLContext::GLContext
            ((GLContext *)local_1c8,context,log_00,1,
             (IVec4 *)&refBuffers.m_stencilbuffer.m_data.m_cap);
  pPVar7 = tcu::RenderTarget::getPixelFormat(this_00);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,8,8,8,(uint)(pPVar7->alphaBits != 0) << 3);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            ((ReferenceContextBuffers *)local_250,
             (PixelFormat *)
             &refContext.m_fragmentDepths.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,0,iVar1,iVar3,1);
  sglr::ReferenceContextLimits::ReferenceContextLimits(&local_6468,context);
  sglr::ReferenceContextBuffers::getColorbuffer(&local_6490,(ReferenceContextBuffers *)local_250);
  sglr::ReferenceContextBuffers::getDepthbuffer(&local_64b8,(ReferenceContextBuffers *)local_250);
  sglr::ReferenceContextBuffers::getStencilbuffer
            ((MultisamplePixelBufferAccess *)&ndx_1,(ReferenceContextBuffers *)local_250);
  sglr::ReferenceContext::ReferenceContext
            ((ReferenceContext *)local_6410,&local_6468,&local_6490,&local_64b8,
             (MultisamplePixelBufferAccess *)&ndx_1);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_6468);
  for (ndx_2 = 0; ndx_2 < 2; ndx_2 = ndx_2 + 1) {
    if (ndx_2 == 0) {
      local_6548 = (Context *)local_1c8;
    }
    else {
      local_6548 = (Context *)local_6410;
    }
    sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6548);
    sglr::ContextWrapper::glClearColor(&this->super_ContextWrapper,0.125,0.25,0.5,1.0);
    sglr::ContextWrapper::glClear(&this->super_ContextWrapper,0x4500);
  }
  texTarget = 0;
  do {
    if (1 < (int)texTarget) {
      for (local_64ec = 0; local_64ec < 2; local_64ec = local_64ec + 1) {
        if (local_64ec == 0) {
          local_6580 = (Context *)local_1c8;
        }
        else {
          local_6580 = (Context *)local_6410;
        }
        sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6580);
        dVar2 = 0x8513;
        if (this->m_texType == TEXTURETYPE_2D) {
          dVar2 = 0xde1;
        }
        sglr::ContextWrapper::glTexParameteri
                  (&this->super_ContextWrapper,dVar2,0x2801,(this->m_flags & 1 | 0x26) << 8);
        sglr::ContextWrapper::glTexParameteri(&this->super_ContextWrapper,dVar2,0x2800,0x2600);
        sglr::ContextWrapper::glTexParameteri(&this->super_ContextWrapper,dVar2,0x2802,0x812f);
        sglr::ContextWrapper::glTexParameteri(&this->super_ContextWrapper,dVar2,0x2803,0x812f);
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      sglr::GLContext::enableLogging((GLContext *)local_1c8,0);
      if (this->m_texType == TEXTURETYPE_2D) {
        verifyTex2D(this,(GLContext *)local_1c8,(ReferenceContext *)local_6410);
      }
      else if (this->m_texType == TEXTURETYPE_CUBE) {
        verifyTexCube(this,(GLContext *)local_1c8,(ReferenceContext *)local_6410);
      }
      sglr::ReferenceContext::~ReferenceContext((ReferenceContext *)local_6410);
      sglr::ReferenceContextBuffers::~ReferenceContextBuffers((ReferenceContextBuffers *)local_250);
      sglr::GLContext::~GLContext((GLContext *)local_1c8);
      de::Random::~Random((Random *)&height);
      return STOP;
    }
    if (texTarget == 0) {
      local_6558 = (Context *)local_1c8;
    }
    else {
      local_6558 = (Context *)local_6410;
    }
    sglr::ContextWrapper::setContext(&this->super_ContextWrapper,local_6558);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    do {
      dVar6 = ::deGetFalse();
      if ((dVar6 != 0) ||
         (dVar2 = sglr::ContextWrapper::glGetError(&this->super_ContextWrapper), dVar2 != 0)) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,(char *)0x0,"glGetError() == GL_NO_ERROR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
                   ,0x1bf);
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    texTarget = texTarget + 1;
  } while( true );
}

Assistant:

TextureSpecCase::IterateResult TextureSpecCase::iterate (void)
{
	glu::RenderContext&			renderCtx				= TestCase::m_context.getRenderContext();
	const tcu::RenderTarget&	renderTarget			= renderCtx.getRenderTarget();
	tcu::TestLog&				log						= m_testCtx.getLog();

	DE_ASSERT(m_width <= 256 && m_height <= 256);
	if (renderTarget.getWidth() < m_width || renderTarget.getHeight() < m_height)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Context size, and viewport for GLES2
	de::Random		rnd			(deStringHash(getName()));
	int				width		= deMin32(renderTarget.getWidth(),	256);
	int				height		= deMin32(renderTarget.getHeight(),	256);
	int				x			= rnd.getInt(0, renderTarget.getWidth()		- width);
	int				y			= rnd.getInt(0, renderTarget.getHeight()	- height);

	// Contexts.
	sglr::GLContext					gles2Context	(renderCtx, log, sglr::GLCONTEXT_LOG_CALLS, tcu::IVec4(x, y, width, height));
	sglr::ReferenceContextBuffers	refBuffers		(tcu::PixelFormat(8,8,8,renderTarget.getPixelFormat().alphaBits?8:0), 0 /* depth */, 0 /* stencil */, width, height);
	sglr::ReferenceContext			refContext		(sglr::ReferenceContextLimits(renderCtx), refBuffers.getColorbuffer(), refBuffers.getDepthbuffer(), refBuffers.getStencilbuffer());

	// Clear color buffer.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);
		glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
		glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	}

	// Construct texture using both GLES2 and reference contexts.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);
		createTexture();
		TCU_CHECK(glGetError() == GL_NO_ERROR);
	}

	// Setup texture filtering state.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		setContext(ndx ? (sglr::Context*)&refContext : (sglr::Context*)&gles2Context);

		deUint32 texTarget = m_texType == TEXTURETYPE_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
		glTexParameteri(texTarget, GL_TEXTURE_MIN_FILTER,	(m_flags & MIPMAPS) ? GL_NEAREST_MIPMAP_NEAREST : GL_NEAREST);
		glTexParameteri(texTarget, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
		glTexParameteri(texTarget, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
		glTexParameteri(texTarget, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
	}

	// Initialize case result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Disable logging.
	gles2Context.enableLogging(0);

	// Verify results.
	switch (m_texType)
	{
		case TEXTURETYPE_2D:	verifyTex2D		(gles2Context, refContext);	break;
		case TEXTURETYPE_CUBE:	verifyTexCube	(gles2Context, refContext);	break;
		default:
			DE_ASSERT(false);
	}

	return STOP;
}